

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O3

double __thiscall ON_SubDMatrix::TestEvaluation(ON_SubDMatrix *this)

{
  double dVar1;
  undefined1 auVar2 [16];
  ON_SubDVertex **ppOVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ON_SubD *pOVar9;
  ON_SubDVertex *center_vertex;
  ON_SubDVertex *pOVar10;
  double *pdVar11;
  long lVar12;
  ulong uVar13;
  ON_3dPoint *p;
  ON_3dPoint *pOVar14;
  int line_number;
  uint j;
  ulong uVar15;
  uint i;
  ulong new_capacity;
  ON_3dPoint *pOVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  uint SP_low_precision_index;
  ON_SimpleArray<const_ON_SubDVertex_*> vertex_ring_array;
  ON_SimpleArray<ON_SubDComponentPtr> component_ring_array;
  ON_SimpleArray<ON_3dPoint> _ringP1;
  ON_SimpleArray<ON_3dPoint> _ringP0;
  double N_Scol_precision [3];
  double N_outer_point_precision [3];
  double N_vertex_point_precision [3];
  ON_SimpleArray<double> _Scol;
  ON_SubD subd;
  ON_SimpleArray<ON_3dPoint> _P;
  ON_SubDSectorIterator sit;
  long local_240;
  double local_238;
  ulong local_228;
  uint local_214;
  ON_3dPoint *local_210;
  char *local_208;
  ON_SubDComponentPtr *local_200;
  double local_1f8;
  ON_SubDVertex **local_1f0;
  ulong local_1e8;
  double **local_1e0;
  ON_SimpleArray<const_ON_SubDVertex_*> local_1d8;
  ON_SimpleArray<ON_SubDComponentPtr> local_1c0;
  long local_1a8;
  ON_3dPoint *local_1a0;
  ulong local_198;
  ON_3dPoint *local_190;
  ON_SimpleArray<ON_3dPoint> local_188;
  ON_SimpleArray<ON_3dPoint> local_170;
  double local_158 [4];
  double local_138 [4];
  double local_118 [4];
  ON_SimpleArray<double> local_f8;
  ON_SubD local_e0;
  ON_SimpleArray<ON_3dPoint> local_c0;
  ON_3dPoint local_a8;
  ON_3dVector local_90;
  ON_SubDSectorIterator local_78;
  
  if (((((this->m_S == (double **)0x0) || (this->m_R < 3)) ||
       (bVar4 = ON_SubDSectorType::IsValid(&this->m_sector_type), !bVar4)) ||
      ((uVar5 = ON_SubDSectorType::FaceCount(&this->m_sector_type), uVar5 == 0 ||
       (uVar6 = ON_SubDSectorType::EdgeCount(&this->m_sector_type), uVar6 == 0)))) ||
     ((uVar7 = ON_SubDSectorType::PointRingCount(&this->m_sector_type), uVar7 == 0 ||
      ((uVar7 != this->m_R ||
       (uVar8 = ON_SubDSectorType::FacetEdgeCount(&this->m_sector_type), uVar8 == 0)))))) {
    ON_SubDIncrementErrorCount();
    uVar17 = 0x9e331dd2;
    uVar18 = 0xffe5f8bd;
    goto LAB_005ff836;
  }
  local_238 = TestMatrix(this);
  local_1e0 = this->m_S;
  local_214 = 0xffffffff;
  new_capacity = (ulong)uVar7;
  local_c0._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00808fd0;
  local_c0.m_a = (ON_3dPoint *)0x0;
  local_c0.m_count = 0;
  local_c0.m_capacity = 0;
  ON_SimpleArray<ON_3dPoint>::SetCapacity(&local_c0,new_capacity);
  local_210 = local_c0.m_a;
  local_f8._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080a228;
  local_f8.m_a = (double *)0x0;
  local_f8.m_count = 0;
  local_f8.m_capacity = 0;
  ON_SimpleArray<double>::SetCapacity(&local_f8,new_capacity);
  pdVar11 = local_f8.m_a;
  ON_SubD::ON_SubD(&local_e0);
  pOVar9 = ON_SubDSectorType::SectorRingSubD(&this->m_sector_type,0.0,0.0,&local_e0);
  if (&local_e0 == pOVar9) {
    center_vertex = ON_SubD::FirstVertex(&local_e0);
    if (((center_vertex == (ON_SubDVertex *)0x0) || (uVar6 != center_vertex->m_edge_count)) ||
       (uVar5 != center_vertex->m_face_count)) {
      ON_SubDIncrementErrorCount();
      goto LAB_005ffeea;
    }
    local_78.m_current_fei[0] = 0;
    local_78.m_current_fei[1] = 0;
    local_78.m_initial_face_dir = 0;
    local_78.m_current_face_dir = 0;
    local_78.m_current_eptr[1].m_ptr = 0;
    local_78.m_initial_fvi = 0;
    local_78.m_current_fvi = 0;
    local_78.m_current_face = (ON_SubDFace *)0x0;
    local_78.m_current_eptr[0].m_ptr = 0;
    local_78.m_center_vertex = (ON_SubDVertex *)0x0;
    local_78.m_initial_face = (ON_SubDFace *)0x0;
    local_78.m_current_ring_index = 0;
    pOVar10 = ON_SubDSectorIterator::Initialize(&local_78,center_vertex);
    if (pOVar10 == (ON_SubDVertex *)0x0) {
      ON_SubDIncrementErrorCount();
      goto LAB_005ffeea;
    }
    uVar5 = ON_SubD::VertexCount(&local_e0);
    local_1d8._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081a1e8;
    local_1d8.m_a = (ON_SubDVertex **)0x0;
    local_1d8.m_count = 0;
    local_1d8.m_capacity = 0;
    if (uVar5 != 0) {
      ON_SimpleArray<const_ON_SubDVertex_*>::SetCapacity(&local_1d8,(ulong)uVar5);
    }
    local_1c0._vptr_ON_SimpleArray = (_func_int **)center_vertex;
    do {
      ON_SimpleArray<const_ON_SubDVertex_*>::Append(&local_1d8,(ON_SubDVertex **)&local_1c0);
      ppOVar3 = local_1d8.m_a;
      local_1c0._vptr_ON_SimpleArray = *(_func_int ***)((long)local_1c0._vptr_ON_SimpleArray + 0x58)
      ;
    } while ((ON_SubDVertex *)local_1c0._vptr_ON_SimpleArray != (ON_SubDVertex *)0x0);
    if (uVar7 == local_1d8.m_count) {
      local_1c0._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00819a00;
      local_1c0.m_a = (ON_SubDComponentPtr *)0x0;
      local_1c0.m_count = 0;
      local_1c0.m_capacity = 0;
      uVar5 = ON_SubD::GetSectorComponentRing(&local_78,&local_1c0);
      if ((uVar5 < 4) ||
         (uVar6 = ON_SubDSectorType::ComponentRingCount(&this->m_sector_type), dVar1 = ON_DBL_QNAN,
         auVar2 = _DAT_0069b120, uVar5 != uVar6)) {
        ON_SubDIncrementErrorCount();
        local_238 = -1.23432101234321e+308;
      }
      else {
        local_1f0 = ppOVar3;
        local_200 = local_1c0.m_a;
        local_170._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00808fd0;
        local_170.m_a = (ON_3dPoint *)0x0;
        local_170.m_count = 0;
        local_170.m_capacity = 0;
        local_188._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00808fd0;
        local_188.m_a = (ON_3dPoint *)0x0;
        local_188.m_count = 0;
        local_188.m_capacity = 0;
        lVar12 = new_capacity - 1;
        auVar20._8_4_ = (int)lVar12;
        auVar20._0_8_ = lVar12;
        auVar20._12_4_ = (int)((ulong)lVar12 >> 0x20);
        uVar13 = 0;
        auVar20 = auVar20 ^ _DAT_0069b120;
        auVar21 = _DAT_0069b170;
        do {
          auVar22 = auVar21 ^ auVar2;
          if ((bool)(~(auVar22._4_4_ == auVar20._4_4_ && auVar20._0_4_ < auVar22._0_4_ ||
                      auVar20._4_4_ < auVar22._4_4_) & 1)) {
            pdVar11[uVar13] = dVar1;
          }
          if ((auVar22._12_4_ != auVar20._12_4_ || auVar22._8_4_ <= auVar20._8_4_) &&
              auVar22._12_4_ <= auVar20._12_4_) {
            pdVar11[uVar13 + 1] = dVar1;
          }
          uVar13 = uVar13 + 2;
          lVar12 = auVar21._8_8_;
          auVar21._0_8_ = auVar21._0_8_ + 2;
          auVar21._8_8_ = lVar12 + 2;
        } while ((new_capacity + 1 & 0xfffffffffffffffe) != uVar13);
        local_198 = 2;
        if (2 < uVar7) {
          local_198 = (ulong)uVar7;
        }
        local_1e8 = (ulong)uVar5;
        local_208 = "x,y,z vertex point precisions are not identical.";
        local_228 = 0;
        do {
          local_118[0] = 0.0;
          local_118[1] = 0.0;
          local_118[2] = 0.0;
          local_138[2] = 0.0;
          local_138[0] = 0.0;
          local_138[1] = 0.0;
          local_158[2] = 0.0;
          local_158[0] = 0.0;
          local_158[1] = 0.0;
          local_1a0 = local_210 + local_228;
          local_240 = 0;
          do {
            local_1f8 = local_238;
            bVar4 = ClearCachedPoints(uVar5,local_200);
            if (!bVar4) {
LAB_005fffa7:
              ON_SubDIncrementErrorCount();
LAB_005fff60:
              local_238 = -1.23432101234321e+308;
              goto LAB_005fff6e;
            }
            local_1f0[local_228]->m_P[local_240] = 1.0;
            uVar6 = ON_SubD::GetSectorPointRing(false,local_1e8,local_200,&local_170);
            if (uVar7 != uVar6) goto LAB_005fffa7;
            local_1a8 = local_240 + 1;
            uVar6 = (uint)local_1a8;
            if (local_1a8 == 3) {
              uVar6 = 0;
            }
            uVar8 = (uint)local_240;
            local_190 = local_170.m_a;
            uVar13 = 0;
            pOVar14 = local_170.m_a;
            do {
              dVar1 = ON_3dPoint::operator[](pOVar14,uVar6);
              if ((dVar1 != 0.0) || (NAN(dVar1))) {
LAB_005fff5b:
                ON_SubDIncrementErrorCount();
                goto LAB_005fff60;
              }
              dVar1 = ON_3dPoint::operator[](pOVar14,((uVar8 + 2) / 3) * -3 + uVar8 + 2);
              if ((dVar1 != 0.0) || (NAN(dVar1))) goto LAB_005fff5b;
              dVar1 = ON_3dPoint::operator[](pOVar14,uVar8);
              dVar19 = 1.0;
              if (local_228 != uVar13) {
                dVar19 = 0.0;
              }
              if ((dVar1 != dVar19) || (NAN(dVar1) || NAN(dVar19))) goto LAB_005fff5b;
              uVar13 = uVar13 + 1;
              pOVar14 = pOVar14 + 1;
            } while (new_capacity != uVar13);
            uVar6 = ON_SubD::GetSectorSubdivisionPointRing(local_200,local_1e8,&local_188);
            pOVar14 = local_188.m_a;
            if (uVar7 != uVar6) {
              ON_SubDIncrementErrorCount();
              goto LAB_005fff60;
            }
            uVar13 = 0;
            do {
              pOVar16 = local_210 + uVar13;
              pOVar16->z = ON_3dPoint::Origin.z;
              dVar1 = ON_3dPoint::Origin.y;
              pOVar16->x = ON_3dPoint::Origin.x;
              pOVar16->y = dVar1;
              uVar15 = 0;
              p = local_190;
              do {
                ::operator*(&local_a8,local_1e0[uVar13][uVar15],p);
                ON_3dVector::ON_3dVector(&local_90,&local_a8);
                ON_3dPoint::operator+=(pOVar16,&local_90);
                uVar15 = uVar15 + 1;
                p = p + 1;
              } while (new_capacity != uVar15);
              uVar13 = uVar13 + 1;
            } while (uVar13 != new_capacity);
            pdVar11 = ON_3dPoint::operator[](local_1a0,uVar8);
            if ((*pdVar11 <= 0.0) ||
               (bVar4 = TestPoint(local_210,0,*pOVar14,uVar8,local_118,&local_214), !bVar4)) {
LAB_005ffffc:
              ON_SubDIncrementErrorCount();
              goto LAB_005fff60;
            }
            if (uVar7 != 1) {
              uVar13 = 1;
              pOVar16 = pOVar14;
              do {
                pOVar16 = pOVar16 + 1;
                bVar4 = TestPoint(local_210,(uint)uVar13,*pOVar16,uVar8,local_138,&local_214);
                if (!bVar4) {
                  ON_SubDIncrementErrorCount();
                  goto LAB_005fff60;
                }
                uVar13 = uVar13 + 1;
              } while (local_198 != uVar13);
            }
            uVar13 = 0;
            do {
              dVar1 = local_1e0[uVar13][local_228];
              dVar19 = ON_3dPoint::operator[](pOVar14,uVar8);
              dVar19 = ABS(dVar1 - dVar19);
              dVar1 = local_158[local_240];
              if (local_158[local_240] < dVar19) {
                local_158[local_240] = dVar19;
                dVar1 = dVar19;
              }
              uVar13 = uVar13 + 1;
              pOVar14 = pOVar14 + 1;
            } while (new_capacity != uVar13);
            if ((local_118[0] != local_118[local_240]) ||
               (NAN(local_118[0]) || NAN(local_118[local_240]))) {
              line_number = 0x19c;
LAB_005fffe2:
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_eval.cpp"
                         ,line_number,"",local_208);
              goto LAB_005ffffc;
            }
            if ((local_138[0] != local_138[local_240]) ||
               (NAN(local_138[0]) || NAN(local_138[local_240]))) {
              line_number = 0x1a1;
              local_208 = "x,y,z outer point precisions are not identical.";
              goto LAB_005fffe2;
            }
            if ((local_158[0] != dVar1) || (NAN(local_158[0]) || NAN(dVar1))) {
              line_number = 0x1a6;
              local_208 = "x,y,z S column precisions are not identical.";
              goto LAB_005fffe2;
            }
            dVar1 = local_118[0];
            if (local_118[0] <= local_1f8) {
              dVar1 = local_1f8;
            }
            dVar19 = local_138[0];
            if (local_138[0] <= dVar1) {
              dVar19 = dVar1;
            }
            local_238 = local_158[0];
            if (local_158[0] <= dVar19) {
              local_238 = dVar19;
            }
            local_1f0[local_228]->m_P[local_240] = 0.0;
            local_240 = local_1a8;
          } while (local_1a8 != 3);
          local_228 = local_228 + 1;
          local_1f8 = local_238;
        } while (local_228 != new_capacity);
LAB_005fff6e:
        ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_188);
        ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_170);
      }
      ON_SimpleArray<ON_SubDComponentPtr>::~ON_SimpleArray(&local_1c0);
    }
    else {
      ON_SubDIncrementErrorCount();
      local_238 = -1.23432101234321e+308;
    }
    ON_SimpleArray<const_ON_SubDVertex_*>::~ON_SimpleArray(&local_1d8);
  }
  else {
    ON_SubDIncrementErrorCount();
LAB_005ffeea:
    local_238 = -1.23432101234321e+308;
  }
  ON_SubD::~ON_SubD(&local_e0);
  ON_SimpleArray<double>::~ON_SimpleArray(&local_f8);
  ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_c0);
  uVar17 = SUB84(local_238,0);
  uVar18 = (undefined4)((ulong)local_238 >> 0x20);
LAB_005ff836:
  return (double)CONCAT44(uVar18,uVar17);
}

Assistant:

double ON_SubDMatrix::TestEvaluation() const
{
  if ( nullptr == m_S || m_R < 3 )
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  if (!m_sector_type.IsValid())
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  const unsigned int F = m_sector_type.FaceCount();
  if (0 == F)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  const unsigned int N = m_sector_type.EdgeCount();
  if (0 == N)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  const unsigned int R = m_sector_type.PointRingCount();
  if (0 == R)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (R != m_R)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  
  const unsigned f_edge_count = m_sector_type.FacetEdgeCount();
  if (0 == f_edge_count)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  double rc = TestMatrix();
  const double*const* S = m_S;
  
  unsigned int SP_low_precision_index = ON_UNSET_UINT_INDEX;
  
  ON_SimpleArray< ON_3dPoint > _P(R);
  ON_3dPoint* SP = _P.Array();

  ON_SimpleArray< double > _Scol(R);
  double* Scol = _Scol.Array();

  ON_SubD subd;
  if (&subd != m_sector_type.SectorRingSubD(0.0,0.0,&subd))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  const ON_SubDVertex* vertex0 = subd.FirstVertex();
  if (nullptr == vertex0)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (N != vertex0->m_edge_count)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (F != vertex0->m_face_count)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  
  ON_SubDSectorIterator sit;
  if ( nullptr == sit.Initialize(vertex0) )
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  ON_SimpleArray<const ON_SubDVertex*> vertex_ring_array(subd.VertexCount());
  for (const ON_SubDVertex* vertex = vertex0; nullptr != vertex; vertex = vertex->m_next_vertex)
  {
    vertex_ring_array.Append(vertex);
  }
  if ( R != vertex_ring_array.UnsignedCount())
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  const ON_SubDVertex*const* vertex_ring = vertex_ring_array.Array();

  ON_SimpleArray<ON_SubDComponentPtr> component_ring_array;
  const unsigned int component_ring_count = ON_SubD::GetSectorComponentRing(sit,component_ring_array);
  if ( component_ring_count < 4 || component_ring_count != m_sector_type.ComponentRingCount())
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  const ON_SubDComponentPtr* component_ring = component_ring_array.Array();

  ON_SimpleArray< ON_3dPoint > _ringP0;

  ON_SimpleArray< ON_3dPoint > _ringP1;

  for (unsigned int vi = 0; vi < R; vi++)
    Scol[vi] = ON_DBL_QNAN;

  for (unsigned int vi = 0; vi < R; vi++)
  {
    double N_vertex_point_precision[3] = { 0 };
    double N_outer_point_precision[3] = { 0 };
    double N_Scol_precision[3] = { 0 };

    for (unsigned int Pi = 0; Pi < 3; Pi++)
    {
      if (false == ClearCachedPoints(component_ring_count,component_ring))
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

      const_cast<ON_SubDVertex*>(vertex_ring[vi])->m_P[Pi] = 1.0;

      if ( R != ON_SubD::GetSectorPointRing(false,component_ring_count,component_ring,_ringP0))
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
      const ON_3dPoint* ringP0 = _ringP0.Array();

      // vertex_ring[]->m_P and ringP0[] should be same point lists
      for (unsigned int i = 0; i < R; i++)
      {
        if (0.0 == ringP0[i][(Pi+1)%3] && 0.0 == ringP0[i][(Pi+2)%3])
        {
          if ( ringP0[i][Pi] == ((i == vi) ? 1.0 : 0.0) )
            continue;
        }
        // vertex_ring[] is not in the expected order or
        // there is a bug in ON_SubD::GetSectorPointRing
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
      }

      if ( R != ON_SubD::GetSectorSubdivisionPointRing(component_ring, component_ring_count,_ringP1))
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
      const ON_3dPoint* ringP1 = _ringP1.Array();

      for (unsigned int i = 0; i < R; i++)
      {
        SP[i] = ON_3dPoint::Origin;
        for (unsigned int j = 0; j < R; j++)
        {
          SP[i] += S[i][j] * ringP0[j];
        }
      }

      if (!(SP[vi][Pi] > 0.0))
      {
        // ON_ERROR("SP[vi][Pi] is not positive.");
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
      }

      if (false == TestPoint(SP, 0, ringP1[0], Pi, N_vertex_point_precision, &SP_low_precision_index))
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

      for (unsigned int j = 1; j < R; j++)
      {
        if (false == TestPoint(SP, j, ringP1[j], Pi, N_outer_point_precision, &SP_low_precision_index))
          return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
      }

      for (unsigned int i = 0; i < R; i++)
      {
        double d = fabs(S[i][vi] - ringP1[i][Pi]);
        if (d > N_Scol_precision[Pi])
          N_Scol_precision[Pi] = d;
      }

      if (!(N_vertex_point_precision[0] == N_vertex_point_precision[Pi]))
      {
        ON_ERROR("x,y,z vertex point precisions are not identical.");
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
      }
      if (!(N_outer_point_precision[0] == N_outer_point_precision[Pi]))
      {
        ON_ERROR("x,y,z outer point precisions are not identical.");
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
      }
      if (!(N_Scol_precision[0] == N_Scol_precision[Pi]))
      {
        ON_ERROR("x,y,z S column precisions are not identical.");
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
      }

      if (rc < N_vertex_point_precision[0])
        rc = N_vertex_point_precision[0];
      if (rc < N_outer_point_precision[0])
        rc = N_outer_point_precision[0];
      if (rc < N_Scol_precision[0])
        rc = N_Scol_precision[0];

      const_cast<ON_SubDVertex*>(vertex_ring[vi])->m_P[Pi] = 0.0;
    }
  }

  return rc; // basic tests passed.
}